

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::combineInto
          (FunctionStructValuesMap<wasm::LUBFinder> *this,
          StructValuesMap<wasm::LUBFinder> *combinedInfos)

{
  bool bVar1;
  reference pvVar2;
  StructValuesMap<wasm::LUBFinder> *infos;
  value_type *kv;
  const_iterator __end0;
  const_iterator __begin0;
  FunctionStructValuesMap<wasm::LUBFinder> *__range3;
  StructValuesMap<wasm::LUBFinder> *combinedInfos_local;
  FunctionStructValuesMap<wasm::LUBFinder> *this_local;
  
  __end0 = std::
           unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
           ::begin(&this->
                    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                  );
  kv = (value_type *)
       std::
       unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
       ::end(&this->
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
            );
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_false>
                       ,(_Node_iterator_base<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_false>
                         *)&kv);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_false,_false>
             ::operator*(&__end0);
    StructValuesMap<wasm::LUBFinder>::combineInto(&pvVar2->second,combinedInfos);
    std::__detail::
    _Node_const_iterator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_false,_false>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void combineInto(StructValuesMap<T>& combinedInfos) const {
    for (auto& kv : *this) {
      const StructValuesMap<T>& infos = kv.second;
      infos.combineInto(combinedInfos);
    }
  }